

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O2

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::ConstraintExprVisitor&>
          (RangeSelectExpression *this,ConstraintExprVisitor *visitor)

{
  Expression::visit<slang::ast::ConstraintExprVisitor&>(this->value_,visitor);
  Expression::visit<slang::ast::ConstraintExprVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::ConstraintExprVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }